

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
slang::ast::FmtHelpers::formatArgs_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FmtHelpers *this,string_view formatString,SourceLocation loc,
          Scope *scope,EvalContext *context,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args,
          bool isStringLiteral)

{
  Compilation *pCVar1;
  SourceRange range;
  function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)> onError;
  bool bVar2;
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  onArg;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> onText;
  string_view str;
  bool ok;
  iterator argIt;
  string result;
  anon_class_16_2_839514d5 getRange;
  byte local_d2;
  undefined1 local_d1;
  Scope *local_d0;
  code *local_c8;
  undefined1 **ppuStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *local_90;
  undefined1 *local_88;
  char **local_80;
  undefined1 *local_78;
  Scope *local_70;
  undefined1 **local_68;
  SourceLocation local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  undefined1 **local_50;
  Scope **local_48;
  EvalContext *local_40;
  Scope *local_38;
  byte *local_30;
  
  local_90 = formatString._M_str;
  local_80 = &local_90;
  local_88 = &local_d1;
  local_d1 = args._0_1_;
  local_68 = &local_88;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_d0 = (context->astCtx).scope.ptr;
  local_48 = &local_d0;
  local_30 = &local_d2;
  local_d2 = 1;
  local_98 = &local_b8;
  local_40 = context;
  ppuStack_c0 = &local_78;
  local_c8 = function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>::
             callback_fn<slang::ast::FmtHelpers::formatArgs[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&,bool)::__2>
  ;
  onError.callable = (intptr_t)ppuStack_c0;
  onError.callback =
       function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>::
       callback_fn<slang::ast::FmtHelpers::formatArgs[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&,bool)::__2>
  ;
  onArg.callable = (intptr_t)&local_60;
  onArg.callback =
       function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
       ::
       callback_fn<slang::ast::FmtHelpers::formatArgs[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&,bool)::__1>
  ;
  onText.callable = (intptr_t)&local_98;
  onText.callback =
       function_ref<void(std::basic_string_view<char,std::char_traits<char>>)>::
       callback_fn<slang::ast::FmtHelpers::formatArgs[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&,bool)::__0>
  ;
  str._M_str = (char *)formatString._M_len;
  str._M_len = (size_t)this;
  local_78 = local_88;
  local_70 = scope;
  local_60 = loc;
  local_58 = local_98;
  local_50 = local_68;
  local_38 = scope;
  bVar2 = SFormat::parse(str,onText,onArg,onError);
  if (local_d0 !=
      (Scope *)(&((context->astCtx).scope.ptr)->compilation +
               *(long *)&(context->astCtx).lookupIndex)) {
    pCVar1 = local_d0->compilation;
    range.startLoc._0_4_ = (pCVar1->options).maxConstexprDepth;
    range.startLoc._4_4_ = (pCVar1->options).maxConstexprSteps;
    range.endLoc._0_4_ = (pCVar1->options).maxConstexprBacktrace;
    range.endLoc._4_4_ = (pCVar1->options).maxDefParamSteps;
    EvalContext::addDiag((EvalContext *)scope,(DiagCode)0x16000b,range);
  }
  local_d2 = bVar2 & local_d2;
  if (local_d2 == 0) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  else {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_b8);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> FmtHelpers::formatArgs(std::string_view formatString, SourceLocation loc,
                                                  const Scope& scope, EvalContext& context,
                                                  const std::span<const Expression* const>& args,
                                                  bool isStringLiteral) {
    auto getRange = [&](size_t offset, size_t len) {
        // If this is not a string literal, we can't meaningfully get an offset.
        if (!isStringLiteral)
            return SourceRange{loc, loc};

        SourceLocation sl = loc + offset;
        return SourceRange{sl, sl + len};
    };

    std::string result;
    auto argIt = args.begin();

    bool ok = true;
    bool parseOk = SFormat::parse(
        formatString, [&](std::string_view text) { result += text; },
        [&](char spec, size_t offset, size_t len, const SFormat::FormatOptions& options) {
            if (formatSpecialArg(spec, scope, result))
                return;

            SourceRange range = getRange(offset, len);
            if (argIt == args.end()) {
                // If we've run out of arguments, this is an error.
                context.addDiag(diag::FormatNoArgument, range) << spec;
                ok = false;
                return;
            }

            auto arg = *argIt++;
            if (arg->kind == ExpressionKind::EmptyArgument) {
                // Empty arguments aren't allowed for format args.
                context.addDiag(diag::FormatEmptyArg, arg->sourceRange) << spec << range;
                ok = false;
                return;
            }

            if (!checkArgType(context, *arg, spec, range)) {
                ok = false;
                return;
            }

            auto&& value = arg->eval(context);
            if (!value) {
                ok = false;
                return;
            }

            SFormat::formatArg(result, value, *arg->type, spec, options, arg->isImplicitString());
        },
        [&](DiagCode code, size_t offset, size_t len, std::optional<char> specifier) {
            // If this is from a string literal format string, we already checked
            // the string at expression creation time, so don't re-issue diagnostics.
            if (isStringLiteral)
                return;

            auto& diag = context.addDiag(code, getRange(offset, len));
            if (specifier)
                diag << *specifier;
        });

    // Leftover arguments are invalid (all must be consumed by the format string).
    if (argIt != args.end())
        context.addDiag(diag::FormatTooManyArgs, (*argIt)->sourceRange);

    ok &= parseOk;
    if (!ok)
        return std::nullopt;

    return result;
}